

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

size_t mz_zip_heap_write_func(void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  long lVar1;
  long lVar2;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  size_t new_capacity;
  void *pNew_block;
  mz_uint64 new_size;
  mz_zip_internal_state *pState;
  mz_zip_archive *pZip;
  size_t n_local;
  void *pBuf_local;
  mz_uint64 file_ofs_local;
  void *pOpaque_local;
  
  lVar1 = *(long *)((long)pOpaque + 0x58);
  if (*(ulong *)(lVar1 + 0x70) < file_ofs + n) {
    local_60 = file_ofs + n;
  }
  else {
    local_60 = *(ulong *)(lVar1 + 0x70);
  }
  if (n == 0) {
    pOpaque_local = (void *)0x0;
  }
  else {
    if (*(ulong *)(lVar1 + 0x78) < local_60) {
      if (*(ulong *)(lVar1 + 0x78) < 0x40) {
        local_68 = 0x40;
      }
      else {
        local_68 = *(ulong *)(lVar1 + 0x78);
      }
      for (local_58 = local_68; local_58 < local_60; local_58 = local_58 << 1) {
      }
      lVar2 = (**(code **)((long)pOpaque + 0x30))
                        (*(undefined8 *)((long)pOpaque + 0x38),*(undefined8 *)(lVar1 + 0x68),1,
                         local_58);
      if (lVar2 == 0) {
        return 0;
      }
      *(long *)(lVar1 + 0x68) = lVar2;
      *(ulong *)(lVar1 + 0x78) = local_58;
    }
    memcpy((void *)(*(long *)(lVar1 + 0x68) + file_ofs),pBuf,n);
    *(ulong *)(lVar1 + 0x70) = local_60;
    pOpaque_local = (void *)n;
  }
  return (size_t)pOpaque_local;
}

Assistant:

static size_t mz_zip_heap_write_func(void *pOpaque, mz_uint64 file_ofs,
                                     const void *pBuf, size_t n) {
  mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
  mz_zip_internal_state *pState = pZip->m_pState;
  mz_uint64 new_size = MZ_MAX(file_ofs + n, pState->m_mem_size);

  if ((!n) ||
      ((sizeof(size_t) == sizeof(mz_uint32)) && (new_size > 0x7FFFFFFF)))
    return 0;

  if (new_size > pState->m_mem_capacity) {
    void *pNew_block;
    size_t new_capacity = MZ_MAX(64, pState->m_mem_capacity);
    while (new_capacity < new_size)
      new_capacity *= 2;
    if (NULL == (pNew_block = pZip->m_pRealloc(
                     pZip->m_pAlloc_opaque, pState->m_pMem, 1, new_capacity)))
      return 0;
    pState->m_pMem = pNew_block;
    pState->m_mem_capacity = new_capacity;
  }
  memcpy((mz_uint8 *)pState->m_pMem + file_ofs, pBuf, n);
  pState->m_mem_size = (size_t)new_size;
  return n;
}